

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::GetValue(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  ValueType VVar1;
  Variant *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  CoroutinePtr CVar2;
  ScriptIPtr s;
  undefined1 local_38 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  shared_ptr<Jinx::IScript> local_20;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>(&local_20);
  this = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
         super__Vector_impl_data._M_start;
  VVar1 = this->m_type;
  if (VVar1 == Coroutine) {
    CVar2 = Jinx::Variant::GetCoroutine((Variant *)local_38);
    (**(code **)(*(long *)local_38._0_8_ + 8))
              (__return_storage_ptr__,local_38._0_8_,
               CVar2.super___shared_ptr<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8);
  }
  else {
    if (VVar1 != CollectionItr) {
      Script::Error((Script *)
                    local_20.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    "\'get value\' called with invalid param type");
      __return_storage_ptr__->m_type = Null;
      Jinx::Variant::SetNull(__return_storage_ptr__);
      goto LAB_001c911d;
    }
    Jinx::Variant::GetCollectionItr((CollectionItrPair *)local_38,this);
    Jinx::Variant::Variant
              (__return_storage_ptr__,(Variant *)&((_Base_ptr)(local_38._0_8_ + 0x40))->_M_parent);
    this_00 = &local_28;
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
LAB_001c911d:
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_20.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetValue(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params[0].IsCollectionItr())
		{
			return params[0].GetCollectionItr().first->second;
		}
		else if (params[0].IsCoroutine())
		{
			return params[0].GetCoroutine()->GetReturnValue();
		}
		s->Error("'get value' called with invalid param type");
		return nullptr;
	}